

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int singlematch(MatchState *ms,char *s,char *p,char *ep)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = 0;
  if (s < ms->src_end) {
    bVar1 = *s;
    bVar2 = *p;
    if (bVar2 == 0x5b) {
      iVar4 = matchbracketclass((uint)bVar1,p,ep + -1);
      return iVar4;
    }
    if (bVar2 == 0x2e) {
      return 1;
    }
    if (bVar2 == 0x25) {
      iVar4 = match_class((uint)bVar1,(uint)(byte)p[1]);
      return iVar4;
    }
    uVar3 = (uint)(bVar2 == bVar1);
  }
  return uVar3;
}

Assistant:

static int singlematch (MatchState *ms, const char *s, const char *p,
                        const char *ep) {
  if (s >= ms->src_end)
    return 0;
  else {
    int c = uchar(*s);
    switch (*p) {
      case '.': return 1;  /* matches any char */
      case L_ESC: return match_class(c, uchar(*(p+1)));
      case '[': return matchbracketclass(c, p, ep-1);
      default:  return (uchar(*p) == c);
    }
  }
}